

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,ImWchar c)

{
  ImDrawList *this_00;
  float local_74;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  float local_40;
  float y;
  float x;
  float scale;
  ImFontGlyph *glyph;
  ImWchar c_local;
  ImVec2 *pIStack_28;
  ImU32 col_local;
  ImVec2 *pos_local;
  ImDrawList *pIStack_18;
  float size_local;
  ImDrawList *draw_list_local;
  ImFont *this_local;
  
  glyph._2_2_ = c;
  glyph._4_4_ = col;
  pIStack_28 = pos;
  pos_local._4_4_ = size;
  pIStack_18 = draw_list;
  draw_list_local = (ImDrawList *)this;
  _x = FindGlyph(this,c);
  if ((_x != (ImFontGlyph *)0x0) && ((*(uint *)_x >> 1 & 1) != 0)) {
    if (((undefined1  [40])*_x & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      glyph._4_4_ = glyph._4_4_ | 0xffffff;
    }
    if (pos_local._4_4_ < 0.0) {
      local_74 = 1.0;
    }
    else {
      local_74 = pos_local._4_4_ / this->FontSize;
    }
    y = local_74;
    local_40 = (float)(int)pIStack_28->x;
    local_44 = (float)(int)pIStack_28->y;
    ImDrawList::PrimReserve(pIStack_18,6,4);
    this_00 = pIStack_18;
    ImVec2::ImVec2(&local_4c,_x->X0 * y + local_40,_x->Y0 * y + local_44);
    ImVec2::ImVec2(&local_54,_x->X1 * y + local_40,_x->Y1 * y + local_44);
    ImVec2::ImVec2(&local_5c,_x->U0,_x->V0);
    ImVec2::ImVec2(&local_64,_x->U1,_x->V1);
    ImDrawList::PrimRectUV(this_00,&local_4c,&local_54,&local_5c,&local_64,glyph._4_4_);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(x + glyph->X0 * scale, y + glyph->Y0 * scale), ImVec2(x + glyph->X1 * scale, y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}